

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

void __thiscall lsim::gui::CircuitEditor::ui_popup_edit_segment(CircuitEditor *this)

{
  initializer_list<lsim::Point> __l;
  bool bVar1;
  Point local_38;
  Point local_30;
  iterator local_28;
  undefined8 local_20;
  ImVec2 local_18;
  CircuitEditor *local_10;
  CircuitEditor *this_local;
  
  local_10 = this;
  bVar1 = ImGui::BeginPopup("edit_segment",0);
  if (bVar1) {
    ImVec2::ImVec2(&local_18,0.0,0.0);
    bVar1 = ImGui::Selectable("Attach wire",false,0,&local_18);
    if (bVar1) {
      this->m_state = CS_CREATE_WIRE;
      local_38 = (this->m_wire_start).m_position;
      local_30 = (this->m_wire_start).m_position;
      local_28 = &local_38;
      local_20 = 2;
      __l._M_len = 2;
      __l._M_array = local_28;
      std::vector<lsim::Point,_std::allocator<lsim::Point>_>::operator=(&this->m_line_anchors,__l);
      this->m_segment_start = (this->m_wire_start).m_position;
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void CircuitEditor::ui_popup_edit_segment() {
	if (ImGui::BeginPopup(POPUP_EDIT_SEGMENT)) {
		if (ImGui::Selectable("Attach wire")) {
			m_state = CS_CREATE_WIRE;
			m_line_anchors = { m_wire_start.m_position, m_wire_start.m_position };
			m_segment_start = m_wire_start.m_position;
		}
		ImGui::EndPopup();
	}
}